

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsMapItemPtr_conflict
xmlDOMWrapNsMapAddItem(xmlNsMapPtr *nsmap,int position,xmlNsPtr oldNs,xmlNsPtr newNs,int depth)

{
  xmlNsMapPtr local_48;
  xmlNsMapPtr map;
  xmlNsMapItemPtr_conflict ret;
  int depth_local;
  xmlNsPtr newNs_local;
  xmlNsPtr oldNs_local;
  int position_local;
  xmlNsMapPtr *nsmap_local;
  
  if (nsmap == (xmlNsMapPtr *)0x0) {
    nsmap_local = (xmlNsMapPtr *)0x0;
  }
  else if ((position == -1) || (position == 0)) {
    local_48 = *nsmap;
    if (local_48 == (xmlNsMapPtr)0x0) {
      local_48 = (xmlNsMapPtr)(*xmlMalloc)(0x18);
      if (local_48 == (xmlNsMapPtr)0x0) {
        xmlTreeErrMemory("allocating namespace map");
        return (xmlNsMapItemPtr_conflict)0x0;
      }
      memset(local_48,0,0x18);
      *nsmap = local_48;
    }
    if (local_48->pool == (xmlNsMapItemPtr_conflict)0x0) {
      map = (xmlNsMapPtr)(*xmlMalloc)(0x28);
      if (map == (xmlNsMapPtr)0x0) {
        xmlTreeErrMemory("allocating namespace map item");
        return (xmlNsMapItemPtr_conflict)0x0;
      }
      memset(map,0,0x28);
    }
    else {
      map = (xmlNsMapPtr)local_48->pool;
      local_48->pool = ((xmlNsMapItemPtr_conflict)map)->next;
      memset(map,0,0x28);
    }
    if (local_48->first == (xmlNsMapItemPtr_conflict)0x0) {
      local_48->first = (xmlNsMapItemPtr_conflict)map;
      local_48->last = (xmlNsMapItemPtr_conflict)map;
    }
    else if (position == -1) {
      map->last = local_48->last;
      local_48->last->next = (xmlNsMapItemPtr)map;
      local_48->last = (xmlNsMapItemPtr_conflict)map;
    }
    else if (position == 0) {
      local_48->first->prev = (xmlNsMapItemPtr)map;
      map->first = local_48->first;
      local_48->first = (xmlNsMapItemPtr_conflict)map;
    }
    map->pool = (xmlNsMapItemPtr_conflict)oldNs;
    map[1].first = (xmlNsMapItemPtr_conflict)newNs;
    *(undefined4 *)&map[1].last = 0xffffffff;
    *(int *)((long)&map[1].last + 4) = depth;
    nsmap_local = (xmlNsMapPtr *)map;
  }
  else {
    nsmap_local = (xmlNsMapPtr *)0x0;
  }
  return (xmlNsMapItemPtr_conflict)nsmap_local;
}

Assistant:

static xmlNsMapItemPtr
xmlDOMWrapNsMapAddItem(xmlNsMapPtr *nsmap, int position,
		       xmlNsPtr oldNs, xmlNsPtr newNs, int depth)
{
    xmlNsMapItemPtr ret;
    xmlNsMapPtr map;

    if (nsmap == NULL)
	return(NULL);
    if ((position != -1) && (position != 0))
	return(NULL);
    map = *nsmap;

    if (map == NULL) {
	/*
	* Create the ns-map.
	*/
	map = (xmlNsMapPtr) xmlMalloc(sizeof(struct xmlNsMap));
	if (map == NULL) {
	    xmlTreeErrMemory("allocating namespace map");
	    return (NULL);
	}
	memset(map, 0, sizeof(struct xmlNsMap));
	*nsmap = map;
    }

    if (map->pool != NULL) {
	/*
	* Reuse an item from the pool.
	*/
	ret = map->pool;
	map->pool = ret->next;
	memset(ret, 0, sizeof(struct xmlNsMapItem));
    } else {
	/*
	* Create a new item.
	*/
	ret = (xmlNsMapItemPtr) xmlMalloc(sizeof(struct xmlNsMapItem));
	if (ret == NULL) {
	    xmlTreeErrMemory("allocating namespace map item");
	    return (NULL);
	}
	memset(ret, 0, sizeof(struct xmlNsMapItem));
    }

    if (map->first == NULL) {
	/*
	* First ever.
	*/
	map->first = ret;
	map->last = ret;
    } else if (position == -1) {
	/*
	* Append.
	*/
	ret->prev = map->last;
	map->last->next = ret;
	map->last = ret;
    } else if (position == 0) {
	/*
	* Set on first position.
	*/
	map->first->prev = ret;
	ret->next = map->first;
	map->first = ret;
    }

    ret->oldNs = oldNs;
    ret->newNs = newNs;
    ret->shadowDepth = -1;
    ret->depth = depth;
    return (ret);
}